

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O1

QList<QStaticPlugin> * QPluginLoader::staticPlugins(void)

{
  Data *pDVar1;
  Type *pTVar2;
  QList<QStaticPlugin> *in_RDI;
  
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    pTVar2 = (Type *)0x0;
  }
  else {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>_>::
             instance();
  }
  if (pTVar2 == (Type *)0x0) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (QStaticPlugin *)0x0;
    (in_RDI->d).size = 0;
  }
  else {
    pDVar1 = (pTVar2->d).d;
    (in_RDI->d).d = pDVar1;
    (in_RDI->d).ptr = (pTVar2->d).ptr;
    (in_RDI->d).size = (pTVar2->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return in_RDI;
}

Assistant:

QList<QStaticPlugin> QPluginLoader::staticPlugins()
{
    StaticPluginList *plugins = staticPluginList();
    if (plugins)
        return *plugins;
    return QList<QStaticPlugin>();
}